

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint allocrule;
  bool bVar1;
  bool generalOptimization;
  int iVar2;
  uint7 uVar3;
  allocator local_2e2;
  allocator local_2e1;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  int local_2d4;
  uint local_2d0;
  undefined4 local_2cc;
  string local_2c8;
  string local_2a8;
  string inputpath;
  string local_268;
  string local_248;
  fmcalc fc;
  sigaction sa;
  
  progname = *argv;
  inputpath._M_dataplus._M_p = (pointer)&inputpath.field_2;
  inputpath._M_string_length = 0;
  inputpath.field_2._M_local_buf[0] = '\0';
  local_2d4 = -1;
  local_2d0 = 0;
  local_2d8 = 0;
  local_2dc = 0;
  local_2cc = 0;
  local_2e0 = 0;
  bVar1 = true;
  do {
    generalOptimization = bVar1;
    iVar2 = getopt(argc,argv,"SdnovhOM:p:a:");
    bVar1 = false;
    switch(iVar2) {
    case 0x6e:
      local_2cc = 1;
      bVar1 = generalOptimization;
      break;
    case 0x6f:
      break;
    case 0x70:
      std::__cxx11::string::assign((char *)&inputpath);
      bVar1 = generalOptimization;
      break;
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
switchD_0010a077_caseD_71:
      help();
LAB_0010a300:
      exit(1);
    case 0x76:
      fprintf(_stderr,"%s : version: %s\n",*argv,"");
      goto LAB_0010a300;
    default:
      if (iVar2 == 0x4d) {
        local_2d4 = atoi(_optarg);
        bVar1 = generalOptimization;
      }
      else {
        uVar3 = (uint7)(uint3)((uint)iVar2 >> 8);
        if (iVar2 == 0x4f) {
          local_2dc = (undefined4)CONCAT71(uVar3,1);
          bVar1 = generalOptimization;
        }
        else if (iVar2 == 0x53) {
          local_2e0 = (undefined4)CONCAT71(uVar3,1);
          bVar1 = generalOptimization;
        }
        else if (iVar2 == 0x61) {
          local_2d0 = atoi(_optarg);
          bVar1 = generalOptimization;
        }
        else {
          if (iVar2 != 100) {
            if (iVar2 == -1) {
              memset(&sa,0,0x98);
              sigemptyset((sigset_t *)&sa.sa_mask);
              sa.__sigaction_handler.sa_handler = segfault_sigaction;
              sa.sa_flags = 4;
              sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
              allocrule = local_2d0;
              if (local_2d0 < 4) {
                std::__cxx11::string::string((string *)&local_248,"",(allocator *)&fc);
                std::__cxx11::string::string((string *)&local_268,"",(allocator *)&local_2c8);
                initstreams(&local_248,&local_268);
                std::__cxx11::string::~string((string *)&local_268);
                std::__cxx11::string::~string((string *)&local_248);
                fmcalc::fmcalc(&fc,local_2d4,allocrule,&inputpath,(bool)((byte)local_2cc & 1),
                               (bool)((byte)local_2d8 & 1),(bool)((byte)local_2dc & 1),
                               generalOptimization,(bool)((byte)local_2e0 & 1));
                std::__cxx11::string::string((string *)&local_2c8,progname,&local_2e1);
                std::__cxx11::string::string((string *)&local_2a8,"INFO",&local_2e2);
                logprintf(&local_2c8,&local_2a8,"starting process..\n");
                std::__cxx11::string::~string((string *)&local_2a8);
                std::__cxx11::string::~string((string *)&local_2c8);
                fmcalc::doit(&fc);
                std::__cxx11::string::string((string *)&local_2c8,progname,&local_2e1);
                std::__cxx11::string::string((string *)&local_2a8,"INFO",&local_2e2);
                logprintf(&local_2c8,&local_2a8,"finishing process..\n");
                std::__cxx11::string::~string((string *)&local_2a8);
                std::__cxx11::string::~string((string *)&local_2c8);
                fmcalc::~fmcalc(&fc);
                std::__cxx11::string::~string((string *)&inputpath);
                return 0;
              }
              fprintf(_stderr,"FATAL:%s: Invalid allocrule %d\n",progname,(ulong)local_2d0);
              goto LAB_0010a300;
            }
            goto switchD_0010a077_caseD_71;
          }
          local_2d8 = (undefined4)CONCAT71(uVar3,1);
          bVar1 = generalOptimization;
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
    int new_max = -1;
	int allocrule = 0;
	int opt;
	std::string inputpath;
	bool debug = false;
	bool allocruleOptimizationOff = false;
	bool generalOptimization = true;

	bool netvalue = false;
	bool stepped = false;
    while ((opt = getopt(argc, argv, "SdnovhOM:p:a:")) != -1) {
        switch (opt) {
		case 'o':
			generalOptimization = false;
			break;
		case 'O':
			allocruleOptimizationOff = true;
			break;
		case 'd':
			debug = true;
			break;
         case 'M':
            new_max = atoi(optarg);
            break;
		 case 'a':
			 allocrule = atoi(optarg);
			 break;
		 case 'v':
			 fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			 exit(EXIT_FAILURE);
			 break;
		 case 'p':
			 inputpath = optarg;
			 break;
		 case 'n':
			 netvalue = true;
			 break;
		 case 'S':
			 stepped = true;
			 break;
        case 'h':
           help();
           exit(EXIT_FAILURE);
        default:
            help();
            exit(EXIT_FAILURE);
        }
    }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	if (allocrule < 0 || allocrule > 3) {
		fprintf(stderr, "FATAL:%s: Invalid allocrule %d\n", progname,allocrule);
		exit(EXIT_FAILURE);
	}

	try {
		initstreams("", "");
		fmcalc fc(new_max, allocrule, inputpath, netvalue,debug, allocruleOptimizationOff, generalOptimization,stepped);
        logprintf(progname, "INFO", "starting process..\n");
		fc.doit();
        logprintf(progname, "INFO", "finishing process..\n");
	}
	catch (const std::bad_alloc &a) {
		fprintf(stderr, "FATAL:%s: bad_alloc: %s\n", progname, a.what());
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}